

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O2

void pztopology::TPZPrism::TShape<double>
               (TPZVec<double> *loc,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  pdVar3 = loc->fStore;
  dVar1 = *pdVar3;
  dVar2 = pdVar3[1];
  dVar7 = pdVar3[2];
  dVar9 = (1.0 - dVar1) - dVar2;
  dVar4 = dVar9 * 0.5;
  dVar8 = 1.0 - dVar7;
  pdVar3 = TPZFMatrix<double>::operator()(phi,0,0);
  *pdVar3 = dVar4 * dVar8;
  dVar5 = dVar1 * 0.5;
  pdVar3 = TPZFMatrix<double>::operator()(phi,1,0);
  *pdVar3 = dVar5 * dVar8;
  dVar6 = dVar2 * 0.5;
  pdVar3 = TPZFMatrix<double>::operator()(phi,2,0);
  *pdVar3 = dVar6 * dVar8;
  dVar7 = dVar7 + 1.0;
  pdVar3 = TPZFMatrix<double>::operator()(phi,3,0);
  *pdVar3 = dVar4 * dVar7;
  pdVar3 = TPZFMatrix<double>::operator()(phi,4,0);
  *pdVar3 = dVar5 * dVar7;
  pdVar3 = TPZFMatrix<double>::operator()(phi,5,0);
  *pdVar3 = dVar6 * dVar7;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,0);
  *pdVar3 = dVar8 * -0.5;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,0);
  *pdVar3 = dVar8 * -0.5;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,0);
  *pdVar3 = dVar9 * -0.5;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,1);
  *pdVar3 = dVar8 * 0.5;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,1);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,1);
  *pdVar3 = dVar1 * -0.5;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,2);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,2);
  *pdVar3 = dVar8 * 0.5;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,2);
  *pdVar3 = dVar2 * -0.5;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,3);
  *pdVar3 = dVar7 * -0.5;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,3);
  *pdVar3 = dVar7 * -0.5;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,3);
  *pdVar3 = dVar4;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,4);
  *pdVar3 = dVar7 * 0.5;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,4);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,4);
  *pdVar3 = dVar5;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,0,5);
  *pdVar3 = 0.0;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,1,5);
  *pdVar3 = dVar7 * 0.5;
  pdVar3 = TPZFMatrix<double>::operator()(dphi,2,5);
  *pdVar3 = dVar6;
  return;
}

Assistant:

inline void TPZPrism::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T qsi = loc[0], eta = loc[1] , zeta  = loc[2];

        phi(0,0)  = .5*(1.-qsi-eta)*(1.-zeta);
        phi(1,0)  = .5*qsi*(1.-zeta);
        phi(2,0)  = .5*eta*(1.-zeta);
        phi(3,0)  = .5*(1.-qsi-eta)*(1.+zeta);
        phi(4,0)  = .5*qsi*(1.+zeta);
        phi(5,0)  = .5*eta*(1.+zeta);

        dphi(0,0) = -.5*(1.-zeta);
        dphi(1,0) = -.5*(1.-zeta);
        dphi(2,0) = -.5*(1.-qsi-eta);
        dphi(0,1) =  .5*(1.-zeta);
        dphi(1,1) =  .0;
        dphi(2,1) = -.5*qsi;
        dphi(0,2) =  .0;
        dphi(1,2) =  .5*(1.-zeta);
        dphi(2,2) = -.5*eta;
        dphi(0,3) = -.5*(1.+zeta);
        dphi(1,3) = -.5*(1.+zeta);
        dphi(2,3) =  .5*(1.-qsi-eta);
        dphi(0,4) =  .5*(1.+zeta);
        dphi(1,4) =  .0;
        dphi(2,4) =  .5*qsi;
        dphi(0,5) =  .0;
        dphi(1,5) =  .5*(1.+zeta);
        dphi(2,5) =  .5*eta;

    }